

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefineVarCommand.cpp
# Opt level: O1

double __thiscall DefineVarCommand::execute(DefineVarCommand *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pcVar3;
  int iVar4;
  Variable *pVVar5;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Variable*>,std::_Select1st<std::pair<std::__cxx11::string_const,Variable*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Variable*>>>
  *p_Var6;
  MathInterpreter *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
  *data;
  long *plVar7;
  size_type *psVar8;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>
  local_58;
  
  iVar4 = std::__cxx11::string::compare
                    ((char *)(this->type_data).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  if (iVar4 == 0) {
    iVar4 = std::__cxx11::string::compare
                      ((char *)((this->type_data).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 2));
    if ((iVar4 == 0) ||
       (iVar4 = std::__cxx11::string::compare
                          ((char *)((this->type_data).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 2)), iVar4 == 0)) {
      pVVar5 = (Variable *)operator_new(0x70);
      pbVar2 = (this->type_data).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar3 = pbVar2[1]._M_dataplus._M_p;
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f8,pcVar3,pcVar3 + pbVar2[1]._M_string_length);
      pbVar2 = (this->type_data).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar3 = pbVar2[2]._M_dataplus._M_p;
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d8,pcVar3,pcVar3 + pbVar2[2]._M_string_length);
      pbVar2 = (this->type_data).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar3 = pbVar2[4]._M_dataplus._M_p;
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,pcVar3,pcVar3 + pbVar2[4]._M_string_length);
      Variable::Variable(pVVar5,&local_f8,&local_d8,&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      p_Var6 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Variable*>,std::_Select1st<std::pair<std::__cxx11::string_const,Variable*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Variable*>>>
                *)DataBase::getInVarMap_abi_cxx11_(d);
      pbVar2 = (this->type_data).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      paVar1 = &local_58.first.field_2;
      pcVar3 = pbVar2[1]._M_dataplus._M_p;
      local_58.first._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,pcVar3,pcVar3 + pbVar2[1]._M_string_length);
      local_58.second = pVVar5;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Variable*>,std::_Select1st<std::pair<std::__cxx11::string_const,Variable*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Variable*>>>
      ::_M_insert_unique<std::pair<std::__cxx11::string_const,Variable*>>(p_Var6,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58.first._M_dataplus._M_p != paVar1) {
        operator_delete(local_58.first._M_dataplus._M_p,
                        local_58.first.field_2._M_allocated_capacity + 1);
      }
      p_Var6 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Variable*>,std::_Select1st<std::pair<std::__cxx11::string_const,Variable*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Variable*>>>
                *)DataBase::getSimVarMap_abi_cxx11_(d);
      pbVar2 = (this->type_data).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar3 = pbVar2[4]._M_dataplus._M_p;
      local_58.first._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,pcVar3,pcVar3 + pbVar2[4]._M_string_length);
      local_58.second = pVVar5;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Variable*>,std::_Select1st<std::pair<std::__cxx11::string_const,Variable*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Variable*>>>
      ::_M_insert_unique<std::pair<std::__cxx11::string_const,Variable*>>(p_Var6,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58.first._M_dataplus._M_p != paVar1) {
        operator_delete(local_58.first._M_dataplus._M_p,
                        local_58.first.field_2._M_allocated_capacity + 1);
      }
    }
    iVar4 = std::__cxx11::string::compare
                      ((char *)((this->type_data).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 2));
    if ((iVar4 == 0) &&
       (pbVar2 = (this->type_data).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       (long)(this->type_data).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 == 0x80)) {
      pVVar5 = (Variable *)operator_new(0x70);
      pcVar3 = pbVar2[1]._M_dataplus._M_p;
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,pcVar3,pcVar3 + pbVar2[1]._M_string_length);
      Variable::Variable(pVVar5,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      p_Var6 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Variable*>,std::_Select1st<std::pair<std::__cxx11::string_const,Variable*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Variable*>>>
                *)DataBase::getInVarMap_abi_cxx11_(d);
      pbVar2 = (this->type_data).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      paVar1 = &local_58.first.field_2;
      pcVar3 = pbVar2[1]._M_dataplus._M_p;
      local_58.first._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,pcVar3,pcVar3 + pbVar2[1]._M_string_length);
      local_58.second = pVVar5;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Variable*>,std::_Select1st<std::pair<std::__cxx11::string_const,Variable*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Variable*>>>
      ::_M_insert_unique<std::pair<std::__cxx11::string_const,Variable*>>(p_Var6,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58.first._M_dataplus._M_p != paVar1) {
        operator_delete(local_58.first._M_dataplus._M_p,
                        local_58.first.field_2._M_allocated_capacity + 1);
      }
      this_00 = (MathInterpreter *)operator_new(0x20);
      data = DataBase::getInVarMap_abi_cxx11_(d);
      MathInterpreter::MathInterpreter(this_00,data);
      pbVar2 = (this->type_data).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::operator+(&local_58.first,pbVar2 + 1,pbVar2 + 2);
      plVar7 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_58,
                                  (ulong)(this->type_data).
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[3]._M_dataplus.
                                         _M_p);
      psVar8 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_78.field_2._M_allocated_capacity = *psVar8;
        local_78.field_2._8_8_ = plVar7[3];
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      }
      else {
        local_78.field_2._M_allocated_capacity = *psVar8;
        local_78._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_78._M_string_length = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      MathInterpreter::insertVariables(this_00,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58.first._M_dataplus._M_p != paVar1) {
        operator_delete(local_58.first._M_dataplus._M_p,
                        local_58.first.field_2._M_allocated_capacity + 1);
      }
      MathInterpreter::~MathInterpreter(this_00);
      operator_delete(this_00,0x20);
    }
    return 0.0;
  }
  printf("failed definning var : wrong input");
  return 0.0;
}

Assistant:

double DefineVarCommand::execute() {
  if (!(this->type_data[0] == "var")) {
    printf("failed definning var : wrong input");
  } else {
    Variable *v;
    if ((this->type_data[2] == "->") || (this->type_data[2] == "<-")) {
      v = new Variable(type_data[1], type_data[2], type_data[4]);
      d->getInVarMap()->insert({this->type_data[1], v});
      d->getSimVarMap()->insert({this->type_data[4], v});
    }
    if ((this->type_data[2] == "=") && (this->type_data.size() == 4)) {
      v = new Variable(this->type_data[1]);
      d->getInVarMap()->insert({this->type_data[1], v});
      MathInterpreter *mi = new MathInterpreter(d->getInVarMap());
      mi->insertVariables(type_data[1] + type_data[2] + type_data[3]);
      delete mi;
    }
  }
  return 0;
}